

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O1

int os_interface_linux_state_set(os_interface *os_if,_Bool up)

{
  ushort uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ushort uVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ifreq ifr;
  
  ifr.ifr_ifru.ifru_map.mem_start = 0;
  ifr.ifr_ifru.ifru_map.mem_end = 0;
  ifr.ifr_ifrn._0_8_ = 0;
  ifr.ifr_ifrn._8_8_ = 0;
  ifr.ifr_ifru._16_8_ = 0;
  pcVar6 = os_if->name;
  strscpy(&ifr,pcVar6,0x10);
  iVar2 = os_system_linux_linux_get_ioctl_fd(2);
  iVar7 = 0;
  iVar2 = ioctl(iVar2,0x8913,&ifr);
  if (iVar2 < 0) {
    uVar9 = (ulong)_oonf_os_interface_subsystem.logging;
    iVar7 = -1;
    if (((&log_global_mask)[uVar9] & 4) != 0) {
      piVar3 = __errno_location();
      pcVar8 = strerror(*piVar3);
      oonf_log(4,uVar9,"src/base/os_linux/os_interface_linux.c",0x197,0,0,
               "ioctl SIOCGIFFLAGS (get flags) error on device %s: %s (%d)\n",pcVar6,pcVar8,*piVar3)
      ;
    }
  }
  else {
    uVar1 = (ushort)ifr.ifr_ifru.ifru_map.mem_start;
    uVar5 = (ushort)up | uVar1 & 0xfffe;
    ifr.ifr_ifru.ifru_addr.sa_family = uVar5;
    if (uVar1 != uVar5) {
      iVar2 = os_system_linux_linux_get_ioctl_fd(2);
      iVar7 = 0;
      iVar2 = ioctl(iVar2,0x8914,&ifr);
      if (iVar2 < 0) {
        uVar9 = (ulong)_oonf_os_interface_subsystem.logging;
        iVar7 = -1;
        if (((&log_global_mask)[uVar9] & 4) != 0) {
          pcVar8 = "down";
          if (up) {
            pcVar8 = "up";
          }
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          oonf_log(4,uVar9,"src/base/os_linux/os_interface_linux.c",0x1aa,0,0,
                   "ioctl SIOCSIFFLAGS (set flags %s) error on device %s: %s (%d)\n",pcVar8,pcVar6,
                   pcVar4,*piVar3);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int
os_interface_linux_state_set(struct os_interface *os_if, bool up) {
  int oldflags;
  struct ifreq ifr;

  memset(&ifr, 0, sizeof(ifr));
  strscpy(ifr.ifr_name, os_if->name, IF_NAMESIZE);

  if (ioctl(os_system_linux_linux_get_ioctl_fd(AF_INET), SIOCGIFFLAGS, &ifr) < 0) {
    OONF_WARN(LOG_OS_INTERFACE, "ioctl SIOCGIFFLAGS (get flags) error on device %s: %s (%d)\n", os_if->name,
      strerror(errno), errno);
    return -1;
  }

  oldflags = ifr.ifr_flags;
  if (up) {
    ifr.ifr_flags |= IFF_UP;
  }
  else {
    ifr.ifr_flags &= ~IFF_UP;
  }

  if (oldflags == ifr.ifr_flags) {
    /* interface is already up/down */
    return 0;
  }

  if (ioctl(os_system_linux_linux_get_ioctl_fd(AF_INET), SIOCSIFFLAGS, &ifr) < 0) {
    OONF_WARN(LOG_OS_INTERFACE, "ioctl SIOCSIFFLAGS (set flags %s) error on device %s: %s (%d)\n", up ? "up" : "down",
      os_if->name, strerror(errno), errno);
    return -1;
  }
  return 0;
}